

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_bench.cc
# Opt level: O3

void renumber<std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>,std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_ids,
               vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
               *elements,int num_threads)

{
  double dVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  atomic<unsigned_long> new_id;
  threadpool pool;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  new_ids;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  new_ids_nc;
  __node_base_ptr local_d8;
  threadpool local_d0;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_b0;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_78;
  vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_> *local_40
  ;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  local_b0._M_buckets = &local_b0._M_single_bucket;
  local_b0._M_bucket_count = 1;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0._M_element_count = 0;
  local_b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0._M_rehash_policy._M_next_resize = 0;
  local_b0._M_single_bucket = (__node_base_ptr)0x0;
  local_d8 = (__node_base_ptr)0x0;
  local_d0.num_threads = 1;
  local_d0.threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = std::chrono::_V2::system_clock::now();
  dVar1 = ceil((double)((ulong)(((long)(vertex_ids->
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(vertex_ids->
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6e) /
                       100) / (double)local_b0._M_rehash_policy._M_max_load_factor);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(&local_b0,(long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1);
  local_78._M_buckets = &local_d8;
  local_78._M_bucket_count = (size_type)&local_b0;
  local_78._M_before_begin._M_nxt = (_Hash_node_base *)vertex_ids;
  threadpool::
  parallel_for<renumber<std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>,std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>(std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<std::array<unsigned_long,4ul>,std::allocator<std::array<unsigned_long,4ul>>>,int)::_lambda(unsigned_long)_1_>
            (&local_d0,
             (long)(vertex_ids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(vertex_ids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3,
             (anon_class_24_3_a8da36f3 *)&local_78);
  lVar3 = std::chrono::_V2::system_clock::now();
  poVar4 = std::ostream::_M_insert<double>(((double)(lVar3 - lVar2) / 1000000000.0) * 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ms ",3);
  local_d0.num_threads = num_threads;
  lVar2 = std::chrono::_V2::system_clock::now();
  local_78._M_buckets = &local_78._M_single_bucket;
  local_78._M_bucket_count = 1;
  local_78._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_78._M_element_count = 0;
  local_78._M_rehash_policy._M_max_load_factor = 1.0;
  local_78._M_rehash_policy._M_next_resize = 0;
  local_78._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::swap(&local_78,&local_b0);
  local_40 = elements;
  local_38 = &local_78;
  threadpool::
  parallel_for<renumber<std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>,std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>(std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<std::array<unsigned_long,4ul>,std::allocator<std::array<unsigned_long,4ul>>>,int)::_lambda(unsigned_long)_2_>
            (&local_d0,
             (long)(elements->
                   super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(elements->
                   super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,
             (anon_class_24_3_a8da36f3 *)&local_40);
  lVar3 = std::chrono::_V2::system_clock::now();
  poVar4 = std::ostream::_M_insert<double>(((double)(lVar3 - lVar2) / 1000000000.0) * 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ms",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_78);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_d0.threads);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_b0);
  return;
}

Assistant:

void renumber(const std::vector< uint64_t > & vertex_ids, 
              std::vector< std::array< uint64_t, 4 > > elements,
              int num_threads) {
    bool supports_parallel_insertion = 
        !std::is_same< Map, std::unordered_map<uint64_t, uint64_t> >::value;

    Map new_ids;
    std::atomic< uint64_t > new_id{ 0 };

    timer stopwatch;
    threadpool pool((supports_parallel_insertion) ? num_threads : 1);

    stopwatch.start();
    new_ids.reserve(vertex_ids.size() * 110 / 100);
    pool.parallel_for(vertex_ids.size(), [&](uint64_t i){
        auto id = new_id++;
        new_ids[vertex_ids[i]] = id;
    });
    stopwatch.stop();
    std::cout << stopwatch.elapsed() * 1000 << "ms ";

    pool.num_threads = num_threads;
    stopwatch.start();
    Map_nomutex new_ids_nc;
    new_ids_nc.swap(new_ids);
    pool.parallel_for(elements.size(), [&](uint64_t i) {
        auto & elem = elements[i];
        elem = {  new_ids_nc.at(elem[0]),
                  new_ids_nc.at(elem[1]),
                  new_ids_nc.at(elem[2]),
                  new_ids_nc.at(elem[3]) };
    });
    stopwatch.stop();
    std::cout << stopwatch.elapsed() * 1000 << "ms" << std::endl;
}